

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::writeString(File *this,string *value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  void *__ptr_00;
  size_t sVar3;
  ulong in_RSI;
  long in_RDI;
  ByteString toWrite;
  ByteString *in_stack_ffffffffffffff68;
  ByteString *in_stack_ffffffffffffffa0;
  undefined1 local_40 [40];
  ulong local_18;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = 0;
    goto LAB_001d1b21;
  }
  local_18 = in_RSI;
  std::__cxx11::string::size();
  ByteString::ByteString(in_stack_ffffffffffffffa0,(unsigned_long)local_40);
  __ptr = ByteString::const_byte_str(in_stack_ffffffffffffff68);
  sVar1 = ByteString::size((ByteString *)0x1d1a31);
  sVar2 = fwrite(__ptr,1,sVar1,*(FILE **)(in_RDI + 0x30));
  sVar1 = ByteString::size((ByteString *)0x1d1a66);
  if (sVar2 == sVar1) {
    __ptr_00 = (void *)std::__cxx11::string::operator[](local_18);
    sVar2 = std::__cxx11::string::size();
    sVar2 = fwrite(__ptr_00,1,sVar2,*(FILE **)(in_RDI + 0x30));
    sVar3 = std::__cxx11::string::size();
    if (sVar2 != sVar3) goto LAB_001d1adb;
    local_1 = 1;
  }
  else {
LAB_001d1adb:
    local_1 = 0;
  }
  ByteString::~ByteString((ByteString *)0x1d1b21);
LAB_001d1b21:
  return (bool)(local_1 & 1);
}

Assistant:

bool File::writeString(const std::string& value)
{
	if (!valid) return false;

	ByteString toWrite((unsigned long) value.size());

	// Write the value to the file
	if ((fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size()) ||
	    (fwrite(&value[0], 1, value.size(), stream) != value.size()))
	{
		return false;
	}

	return true;
}